

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void fieldsel(LexState *ls,expdesc *v)

{
  FuncState *fs;
  TString *s;
  expdesc key;
  expdesc local_30;
  
  fs = ls->fs;
  luaK_exp2anyregup(fs,v);
  luaX_next(ls);
  s = str_checkname(ls);
  local_30.u.info = luaK_stringK(ls->fs,s);
  local_30.t = -1;
  local_30.f = -1;
  local_30.k = VK;
  luaK_indexed(fs,v,&local_30);
  return;
}

Assistant:

static void fieldsel(LexState *ls, expdesc *v) {
    /* fieldsel -> ['.' | ':'] NAME */
    FuncState *fs = ls->fs;
    expdesc key;
    luaK_exp2anyregup(fs, v);
    luaX_next(ls);  /* skip the dot or colon */
    checkname(ls, &key);
    luaK_indexed(fs, v, &key);
}